

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_stringlist(void *reference,size_t bin_size,const_strarray *value)

{
  strarray *array;
  const_strarray *value_local;
  size_t bin_size_local;
  void *reference_local;
  
  if (bin_size == 0x10) {
    if (*value->value == '\0') {
      memset(reference,0,0x10);
      reference_local._4_4_ = 0;
    }
    else {
      reference_local._4_4_ = strarray_copy((strarray *)reference,(strarray *)value);
    }
  }
  else {
    reference_local._4_4_ = -1;
  }
  return reference_local._4_4_;
}

Assistant:

int
cfg_tobin_stringlist(void *reference, size_t bin_size, const struct const_strarray *value) {
  struct strarray *array;

  if (bin_size != sizeof(*array)) {
    return -1;
  }

  array = (struct strarray *)reference;

  if (!value->value[0]) {
    strarray_init(array);
    return 0;
  }
  return strarray_copy_c(array, value);
}